

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_
                   (AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,AlphaNum *e)

{
  size_t sVar1;
  AlphaNum *x2;
  AlphaNum *x3;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  AlphaNum *in_RDI;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  char *out;
  char *begin;
  string *result;
  AlphaNum *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  AlphaNum *x4;
  AlphaNum *out_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  reference local_50;
  undefined1 local_31;
  AlphaNum *local_30;
  AlphaNum *local_28;
  AlphaNum *local_20;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_31 = 0;
  out_00 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar1 = strings::AlphaNum::size(local_10);
  x2 = (AlphaNum *)strings::AlphaNum::size(local_18);
  x4 = (AlphaNum *)(x2->digits + (sVar1 - 0x10));
  x3 = (AlphaNum *)strings::AlphaNum::size(local_20);
  strings::AlphaNum::size(local_28);
  strings::AlphaNum::size(local_30);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_58);
  Append4((char *)out_00,in_RDI,x2,x3,x4);
  Append1(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  return (string *)out_00;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d, const AlphaNum &e) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append1(out, e);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}